

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

int * __thiscall
dnet::data_types::tensor<int,_3U>::operator[](tensor<int,_3U> *this,array<unsigned_int,_3UL> *i)

{
  value_type_conflict1 vVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  exception *__return_storage_ptr__;
  reference pvVar8;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  ulong local_30;
  size_t t;
  axes_type ii;
  array<unsigned_int,_3UL> *i_local;
  tensor<int,_3U> *this_local;
  
  local_30 = 0;
  ii._M_elems._4_8_ = i;
  while( true ) {
    uVar2 = local_30;
    sVar5 = std::array<unsigned_int,_3UL>::size((array<unsigned_int,_3UL> *)ii._M_elems._4_8_);
    if (sVar5 <= uVar2) break;
    pvVar6 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)ii._M_elems._4_8_,local_30);
    vVar1 = *pvVar6;
    pvVar7 = std::array<unsigned_int,_3UL>::operator[](&this->_axes_sort,local_30);
    pvVar7 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)((long)&t + 4),(ulong)*pvVar7);
    *pvVar7 = vVar1;
    local_30 = local_30 + 1;
  }
  bVar3 = check(this,(axes_type *)ii._M_elems._4_8_);
  if (!bVar3) {
    __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"matrix",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"Index out of range.",&local_89);
    misc::make_error(__return_storage_ptr__,&local_50,&local_88);
    __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
  }
  iVar4 = to_index(this,(array<unsigned_int,_3UL> *)((long)&t + 4));
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->_data,(long)iVar4);
  return pvVar8;
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }